

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderingUtils.hpp
# Opt level: O3

void __thiscall
Kernel::MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_>::MultiSet
          (MultiSet<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *this,
          Stack<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>_> *elems)

{
  tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
  **pptVar1;
  long lVar2;
  int iVar3;
  size_t sVar4;
  tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
  *ptVar5;
  ulong uVar6;
  _Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
  *this_00;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *pMVar7;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> *a;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> elem;
  IntegerConstantType n;
  Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_> local_90;
  __mpz_struct local_70;
  _Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
  local_60;
  
  a = elems->_stack;
  pMVar7 = elems->_cursor;
  sVar4 = (long)pMVar7 - (long)a >> 5;
  (this->_elems)._capacity = sVar4;
  if (pMVar7 == a) {
    (this->_elems)._stack =
         (tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
          *)0x0;
    sVar4 = 0;
    ptVar5 = (tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
              *)0x0;
  }
  else {
    uVar6 = sVar4 * 0x30;
    if (uVar6 == 0) {
      ptVar5 = (tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                *)Lib::FixedSizeAllocator<8UL>::alloc
                            ((FixedSizeAllocator<8UL> *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR);
    }
    else if (uVar6 < 0x11) {
      ptVar5 = (tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                *)Lib::FixedSizeAllocator<16UL>::alloc
                            ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18)
                            );
    }
    else if (uVar6 < 0x19) {
      ptVar5 = (tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                *)Lib::FixedSizeAllocator<24UL>::alloc
                            ((FixedSizeAllocator<24UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30)
                            );
    }
    else if (uVar6 < 0x21) {
      ptVar5 = (tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                *)Lib::FixedSizeAllocator<32UL>::alloc
                            ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48)
                            );
    }
    else if (uVar6 < 0x31) {
      ptVar5 = (tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                *)Lib::FixedSizeAllocator<48UL>::alloc
                            ((FixedSizeAllocator<48UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60)
                            );
    }
    else if (uVar6 < 0x41) {
      ptVar5 = (tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                *)Lib::FixedSizeAllocator<64UL>::alloc
                            ((FixedSizeAllocator<64UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78)
                            );
    }
    else {
      ptVar5 = (tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
                *)::operator_new(uVar6,0x10);
    }
    (this->_elems)._stack = ptVar5;
    sVar4 = (this->_elems)._capacity;
    a = elems->_stack;
    pMVar7 = elems->_cursor;
  }
  (this->_elems)._cursor = ptVar5;
  (this->_elems)._end = ptVar5 + sVar4;
  if (a != pMVar7) {
    uVar6 = (long)pMVar7 - (long)a >> 5;
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (a,pMVar7,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>*,__gnu_cxx::__ops::_Iter_less_iter>
              (a,pMVar7);
    a = elems->_stack;
    pMVar7 = elems->_cursor;
  }
  if (a != pMVar7) {
    do {
      IntegerConstantType::IntegerConstantType(&local_90.numeral,&a->numeral);
      local_90.factors._id = (a->factors)._id;
      local_90.factors._ptr = (a->factors)._ptr;
      IntegerConstantType::IntegerConstantType((IntegerConstantType *)&local_70,1);
      pMVar7 = a;
      while ((a = pMVar7 + 1, a != elems->_cursor && (pMVar7[1].factors._id == local_90.factors._id)
             )) {
        iVar3 = mpz_cmp((__mpz_struct *)a,(__mpz_struct *)&local_90);
        if (iVar3 != 0) break;
        mpz_add_ui(&local_70,&local_70,1);
        pMVar7 = a;
      }
      std::
      _Tuple_impl<0ul,Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::IntegerConstantType>
      ::
      _Tuple_impl<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>&,Kernel::IntegerConstantType&,void>
                ((_Tuple_impl<0ul,Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::IntegerConstantType>
                  *)&local_60,&local_90,(IntegerConstantType *)&local_70);
      this_00 = &((this->_elems)._cursor)->
                 super__Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
      ;
      if (this_00 ==
          &((this->_elems)._end)->
           super__Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
         ) {
        Lib::
        Stack<std::tuple<Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>_>
        ::expand(&this->_elems);
        this_00 = &((this->_elems)._cursor)->
                   super__Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
        ;
      }
      std::
      _Tuple_impl<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::IntegerConstantType>
      ::_Tuple_impl(this_00,&local_60);
      pptVar1 = &(this->_elems)._cursor;
      *pptVar1 = *pptVar1 + 1;
      mpz_clear((__mpz_struct *)
                &local_60.
                 super__Head_base<0UL,_Kernel::Monom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_false>
               );
      mpz_clear((__mpz_struct *)&local_60);
      mpz_clear(&local_70);
      mpz_clear((__mpz_struct *)&local_90);
    } while (a != elems->_cursor);
  }
  return;
}

Assistant:

MultiSet(Stack<T> elems) 
      : _elems(elems.size()) 
    {
      std::sort(elems.begin(), elems.end());
      auto iter = elems.begin();
      while (iter != elems.end()) {
        auto elem = *iter++;
        auto n = IntegerConstantType(1);
        while (iter != elems.end() && *iter == elem) {
          ++n;
          iter++;
        }
        _elems.push(std::make_tuple(elem, n));
      }
    }